

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void write_config_options(FILE *fp,nh_option_desc *options)

{
  undefined8 uVar1;
  char *optval;
  wchar_t i;
  nh_option_desc *options_local;
  FILE *fp_local;
  
  optval._4_4_ = 0;
  while (options[optval._4_4_].name != (char *)0x0) {
    uVar1 = nh_get_option_string(options + optval._4_4_);
    if ((options[optval._4_4_].type == OPTTYPE_STRING) ||
       (options[optval._4_4_].type == OPTTYPE_ENUM)) {
      fprintf((FILE *)fp,"%s=\"%s\"\n",options[optval._4_4_].name,uVar1);
    }
    else {
      fprintf((FILE *)fp,"%s=%s\n",options[optval._4_4_].name,uVar1);
    }
    optval._4_4_ = optval._4_4_ + 1;
  }
  return;
}

Assistant:

static void write_config_options(FILE *fp, struct nh_option_desc *options)
{
    int i;
    const char *optval;
    
    for (i = 0; options[i].name; i++) {
	optval = nh_get_option_string(&options[i]);
	if (options[i].type == OPTTYPE_STRING ||
	    options[i].type == OPTTYPE_ENUM)
	    fprintf(fp, "%s=\"%s\"\n", options[i].name, optval);
	else
	    fprintf(fp, "%s=%s\n", options[i].name, optval);
    }
}